

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_buffer_header(void *buf,size_t bufsiz,char *fid)

{
  flatbuffers_thash_t fVar1;
  flatbuffers_thash_t fVar2;
  int c_3;
  int c_2;
  int c_1;
  int c;
  flatbuffers_thash_t id2;
  flatbuffers_thash_t id;
  char *fid_local;
  size_t bufsiz_local;
  void *buf_local;
  
  if (((ulong)buf & 3) == 0) {
    if (bufsiz < 0xfffffff8) {
      if (bufsiz < 8) {
        buf_local._4_4_ = 1;
      }
      else {
        if (fid != (char *)0x0) {
          fVar1 = read_thash_identifier(fid);
          fVar2 = read_thash(buf,4);
          if (fVar1 != 0 && fVar2 != fVar1) {
            return 2;
          }
        }
        buf_local._4_4_ = 0;
      }
    }
    else {
      buf_local._4_4_ = 6;
    }
  }
  else {
    buf_local._4_4_ = 5;
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_buffer_header(const void *buf, size_t bufsiz, const char *fid)
{
    thash_t id, id2;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);
    /*
     * Even if we specify no fid, the user might later. Therefore
     * require space for it. Not all buffer generators will take this
     * into account, so it is possible to fail an otherwise valid buffer
     * - but such buffers aren't safe.
     */
    verify(bufsiz >= offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);
    if (fid != 0) {
        id2 = read_thash_identifier(fid);
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    return flatcc_verify_ok;
}